

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O3

bool __thiscall
Js::EquivalentTypeSet::Contains(EquivalentTypeSet *this,JITTypeHolder type,uint16 *pIndex)

{
  bool bVar1;
  uint16 index;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder type_local;
  
  local_40.t = type.t;
  if (this->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(this);
  }
  if (this->count != 0) {
    index = 0;
    do {
      type_local = GetType(this,index);
      bVar1 = JITTypeHolderBase<void>::operator==(&type_local,&local_40);
      if (bVar1) {
        if (pIndex == (uint16 *)0x0) {
          return true;
        }
        *pIndex = index;
        return true;
      }
      index = index + 1;
    } while (index < this->count);
  }
  return false;
}

Assistant:

bool EquivalentTypeSet::Contains(const JITTypeHolder type, uint16* pIndex)
{
    if (!this->GetSortedAndDuplicatesRemoved())
    {
        this->SortAndRemoveDuplicates();
    }
    for (uint16 ti = 0; ti < this->count; ti++)
    {
        if (this->GetType(ti) == type)
        {
            if (pIndex)
            {
                *pIndex = ti;
            }
            return true;
        }
    }
    return false;
}